

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecx_kmgmt.c
# Opt level: O0

void * ecx_gen(ecx_gen_ctx *gctx)

{
  int iVar1;
  ECX_KEY *out_public_key;
  ECX_KEY *key_00;
  uint8_t *private_key;
  OSSL_LIB_CTX *in_RDI;
  uchar *unaff_retaddr;
  uchar *privkey;
  ECX_KEY *key;
  char *in_stack_000000c0;
  uint8_t *in_stack_000000c8;
  uint8_t *in_stack_000000d0;
  OSSL_LIB_CTX *in_stack_000000d8;
  uint8_t *in_stack_00000128;
  uint8_t *in_stack_00000130;
  char *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  OSSL_LIB_CTX *in_stack_fffffffffffffff8;
  
  if (in_RDI == (OSSL_LIB_CTX *)0x0) {
    return (void *)0x0;
  }
  out_public_key =
       ossl_ecx_key_new(in_stack_fffffffffffffff8,(ECX_KEY_TYPE)((ulong)in_RDI >> 0x20),(int)in_RDI,
                        in_stack_ffffffffffffffe8);
  if (out_public_key == (ECX_KEY *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)out_public_key >> 0x20),in_stack_ffffffffffffffe0);
    ERR_set_error(0x39,0xc0100,(char *)0x0);
    return (void *)0x0;
  }
  if (((ulong)(in_RDI->data).sk & 0x300000000) == 0) {
    return out_public_key;
  }
  key_00 = (ECX_KEY *)ossl_ecx_key_allocate_privkey((ECX_KEY *)0x337643);
  if (key_00 == (ECX_KEY *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)out_public_key >> 0x20),(char *)key_00);
    ERR_set_error(0x39,0xc0100,(char *)0x0);
    goto LAB_003377ca;
  }
  iVar1 = RAND_priv_bytes_ex((OSSL_LIB_CTX *)privkey,unaff_retaddr,(size_t)in_stack_fffffffffffffff8
                             ,(uint)((ulong)in_RDI >> 0x20));
  if (iVar1 < 1) goto LAB_003377ca;
  private_key = (uint8_t *)(ulong)*(uint *)&(in_RDI->data).sk;
  switch(private_key) {
  case (uint8_t *)0x0:
    *(byte *)&key_00->libctx = *(byte *)&key_00->libctx & 0xf8;
    key_00->pubkey[0xe] = key_00->pubkey[0xe] & 0x7f;
    key_00->pubkey[0xe] = key_00->pubkey[0xe] | 0x40;
    ossl_x25519_public_from_private(in_stack_00000130,in_stack_00000128);
    break;
  case (uint8_t *)0x1:
    *(byte *)&key_00->libctx = *(byte *)&key_00->libctx & 0xfc;
    key_00->pubkey[0x26] = key_00->pubkey[0x26] | 0x80;
    ossl_x448_public_from_private((uint8_t *)key_00,private_key);
    break;
  case (uint8_t *)0x2:
    iVar1 = ossl_ed25519_public_from_private
                      (in_stack_000000d8,in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
    goto joined_r0x003377a7;
  case (uint8_t *)0x3:
    iVar1 = ossl_ed448_public_from_private
                      (in_RDI,(uint8_t *)out_public_key,(uint8_t *)key_00,(char *)private_key);
joined_r0x003377a7:
    if (iVar1 == 0) {
LAB_003377ca:
      ossl_ecx_key_free(key_00);
      return (void *)0x0;
    }
  }
  out_public_key->field_0x10 = out_public_key->field_0x10 & 0xfe | 1;
  return out_public_key;
}

Assistant:

static void *ecx_gen(struct ecx_gen_ctx *gctx)
{
    ECX_KEY *key;
    unsigned char *privkey;

    if (gctx == NULL)
        return NULL;
    if ((key = ossl_ecx_key_new(gctx->libctx, gctx->type, 0,
                                gctx->propq)) == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    /* If we're doing parameter generation then we just return a blank key */
    if ((gctx->selection & OSSL_KEYMGMT_SELECT_KEYPAIR) == 0)
        return key;

    if ((privkey = ossl_ecx_key_allocate_privkey(key)) == NULL) {
        ERR_raise(ERR_LIB_PROV, ERR_R_MALLOC_FAILURE);
        goto err;
    }
    if (RAND_priv_bytes_ex(gctx->libctx, privkey, key->keylen, 0) <= 0)
        goto err;
    switch (gctx->type) {
    case ECX_KEY_TYPE_X25519:
        privkey[0] &= 248;
        privkey[X25519_KEYLEN - 1] &= 127;
        privkey[X25519_KEYLEN - 1] |= 64;
        ossl_x25519_public_from_private(key->pubkey, privkey);
        break;
    case ECX_KEY_TYPE_X448:
        privkey[0] &= 252;
        privkey[X448_KEYLEN - 1] |= 128;
        ossl_x448_public_from_private(key->pubkey, privkey);
        break;
    case ECX_KEY_TYPE_ED25519:
        if (!ossl_ed25519_public_from_private(gctx->libctx, key->pubkey, privkey,
                                              gctx->propq))
            goto err;
        break;
    case ECX_KEY_TYPE_ED448:
        if (!ossl_ed448_public_from_private(gctx->libctx, key->pubkey, privkey,
                                            gctx->propq))
            goto err;
        break;
    }
    key->haspubkey = 1;
    return key;
err:
    ossl_ecx_key_free(key);
    return NULL;
}